

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

bool __thiscall
Ptex::v2_2::PtexReader::readBlock(PtexReader *this,void *data,int size,bool reporterror)

{
  int iVar1;
  
  if (-1 < size && this->_fp != (Handle)0x0) {
    iVar1 = (*this->_io->_vptr_PtexInputHandler[4])(this->_io,data,(ulong)(uint)size);
    if (iVar1 == size) {
      this->_pos = this->_pos + (ulong)(uint)size;
      return true;
    }
    if (reporterror) {
      setError(this,"PtexReader error: read failed (EOF)");
    }
  }
  return false;
}

Assistant:

bool PtexReader::readBlock(void* data, int size, bool reporterror)
{
    assert(_fp && size >= 0);
    if (!_fp || size < 0) return false;
    int result = (int)_io->read(data, size, _fp);
    if (result == size) {
        _pos += size;
        return true;
    }
    if (reporterror)
        setError("PtexReader error: read failed (EOF)");
    return false;
}